

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPSCQueue.h
# Opt level: O3

void __thiscall
rigtorp::SPSCQueue<TestType,_std::allocator<TestType>_>::~SPSCQueue
          (SPSCQueue<TestType,_std::allocator<TestType>_> *this)

{
  __int_type_conflict _Var1;
  __int_type_conflict _Var2;
  TestType *pTVar3;
  
  do {
    _Var1 = (this->readIdx_).super___atomic_base<unsigned_long>._M_i;
    if (_Var1 == this->writeIdxCache_) {
      _Var2 = (this->writeIdx_).super___atomic_base<unsigned_long>._M_i;
      this->writeIdxCache_ = _Var2;
      pTVar3 = this->slots_;
      if (_Var2 == _Var1) {
LAB_001032a1:
        operator_delete(pTVar3,this->capacity_ + 0x80);
        return;
      }
    }
    else {
      pTVar3 = this->slots_;
    }
    if (pTVar3 + _Var1 == (TestType *)0xffffffffffffffc0) goto LAB_001032a1;
    pop(this);
  } while( true );
}

Assistant:

~SPSCQueue() {
    while (front()) {
      pop();
    }
    std::allocator_traits<Allocator>::deallocate(allocator_, slots_,
                                                 capacity_ + 2 * kPadding);
  }